

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void GameLoop(Board *board)

{
  undefined8 in_RAX;
  int iVar1;
  char choice;
  int frames;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  system("clear");
  Board::PrintBoard(board);
  do {
    while( true ) {
      while( true ) {
        std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x1070d0);
        std::istream::ignore((long)&std::cin,1000);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "(n)ext iteration / (s)pecify frames to advance, / e(x)it: ",0x3a);
        std::operator>>((istream *)&std::cin,(char *)((long)&uStack_38 + 3));
        if (uStack_38._3_1_ != 'n') break;
        Board::Tick(board);
        system("clear");
        Board::PrintBoard(board);
      }
      if (uStack_38._3_1_ == 's') break;
      if (uStack_38._3_1_ == 'x') {
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Invalid selection. Please try again.",0x24);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
    }
    uStack_38 = CONCAT44(1,(undefined4)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Enter the number of frames you would like to advance: ",0x36);
    std::istream::operator>>((istream *)&std::cin,(int *)((long)&uStack_38 + 4));
    if (0 < uStack_38._4_4_) {
      iVar1 = 0;
      do {
        Board::Tick(board);
        system("clear");
        Board::PrintBoard(board);
        usleep(100000);
        iVar1 = iVar1 + 1;
      } while (iVar1 < uStack_38._4_4_);
    }
  } while( true );
}

Assistant:

void GameLoop(Board &board)
{
    system("clear");
    board.PrintBoard();
    bool exit = false;
    do
    {
        char choice;

        //Just in case the user entered extra/invalid input
        std::cin.clear();
        std::cin.ignore(1000, '\n');

        std::cout << "(n)ext iteration / (s)pecify frames to advance, / e(x)it: ";
        std::cin >> choice;
        switch(choice)
        {
            case 'n':
                board.Tick();
                system("clear");
                board.PrintBoard();
                break;
            case 's':
            {
                int frames = 1;
                std::cout << "Enter the number of frames you would like to advance: ";
                std::cin >> frames;
                for (int x = 0; x < frames; x++)
                {
                    board.Tick();
                    system("clear");
                    board.PrintBoard();
                    usleep(100000);
                }
                break;
            }
            case 'x':
                exit = true;
                break;
            default:
                std::cout << "Invalid selection. Please try again." << std::endl;
                break;
        }
    } while(!exit);
}